

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval.hpp
# Opt level: O3

ostream * viennamath::operator<<
                    (ostream *stream,rt_interval<viennamath::rt_expression_interface<double>_> *e)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"interval(",9);
  poVar1 = operator<<(stream,&e->lower_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = operator<<(poVar1,&e->upper_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream & stream, rt_interval<InterfaceType> const & e)
  {
    stream << "interval(" << e.lower() << ", " << e.upper() << ")";
    return stream;
  }